

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
image_match::get_image_paths
          (vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
           *__return_storage_ptr__,path *root)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  path *filepath;
  vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  *image_paths;
  recursive_directory_iterator __begin1;
  recursive_directory_iterator __end1;
  path normalized;
  path local_110;
  recursive_directory_iterator local_e8;
  basic_string_view<char> local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  recursive_directory_iterator local_98;
  recursive_directory_iterator local_88;
  recursive_directory_iterator local_78;
  recursive_directory_iterator local_68;
  path local_58;
  
  std::filesystem::absolute(&local_110);
  std::filesystem::__cxx11::path::lexically_normal();
  CLI::std::filesystem::__cxx11::path::~path((path *)&local_110);
  paVar1 = &local_110._M_pathname.field_2;
  local_110._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,local_58._M_pathname._M_dataplus._M_p,
             local_58._M_pathname._M_dataplus._M_p + local_58._M_pathname._M_string_length);
  if (spdlog::details::registry::instance()::s_instance == '\0') {
    iVar5 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance);
    if (iVar5 != 0) {
      spdlog::details::registry::registry
                ((registry *)spdlog::details::registry::instance()::s_instance);
      __cxa_atexit(spdlog::details::registry::~registry,
                   spdlog::details::registry::instance()::s_instance,&__dso_handle);
      __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
    }
  }
  local_c8._0_8_ = (char *)0x0;
  local_c8._8_8_ = 0;
  local_b8[0]._M_allocated_capacity = (char *)0x0;
  local_d8.data_ = "Searching for images in {}";
  local_d8.size_ = 0x1a;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
            ((logger *)spdlog::details::registry::instance()::s_instance._280_8_,loc,info,&local_d8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_pathname._M_dataplus._M_p,
                    local_110._M_pathname.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::recursive_directory_iterator
            (&local_e8,&local_58,none,(error_code *)0x0);
  if (local_e8._M_dirs._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count =
           (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count =
           (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_98._M_dirs._M_ptr = local_e8._M_dirs._M_ptr;
  local_98._M_dirs._M_refcount._M_pi = local_e8._M_dirs._M_refcount._M_pi;
  local_68._M_dirs._M_ptr = (element_type *)0x0;
  local_68._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_68);
  local_78._M_dirs._M_ptr = local_e8._M_dirs._M_ptr;
  local_78._M_dirs._M_refcount._M_pi = local_e8._M_dirs._M_refcount._M_pi;
  if (local_e8._M_dirs._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count =
           (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count =
           (local_e8._M_dirs._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_88._M_dirs._M_ptr = (element_type *)0x0;
  local_88._M_dirs._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_78);
  while (local_98._M_dirs._M_refcount._M_pi != local_88._M_dirs._M_refcount._M_pi) {
    filepath = (path *)std::filesystem::__cxx11::recursive_directory_iterator::operator*(&local_98);
    if (spdlog::details::registry::instance()::s_instance == '\0') {
      iVar5 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance);
      if (iVar5 != 0) {
        spdlog::details::registry::registry
                  ((registry *)spdlog::details::registry::instance()::s_instance);
        __cxa_atexit(spdlog::details::registry::~registry,
                     spdlog::details::registry::instance()::s_instance,&__dso_handle);
        __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
      }
    }
    uVar3 = spdlog::details::registry::instance()::s_instance._280_8_;
    pcVar2 = (filepath->_M_pathname)._M_dataplus._M_p;
    local_110._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,pcVar2,pcVar2 + (filepath->_M_pathname)._M_string_length);
    local_c8._0_8_ =
         "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
    ;
    local_c8._8_4_ = 0xad;
    local_b8[0]._M_allocated_capacity = "get_image_paths";
    local_d8.data_ = "Found file {}";
    local_d8.size_ = 0xd;
    loc_00._8_8_ = local_c8._8_8_;
    loc_00.filename =
         "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
    ;
    loc_00.funcname = "get_image_paths";
    spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
              ((logger *)uVar3,loc_00,debug,&local_d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_110._M_pathname._M_dataplus._M_p,
                      local_110._M_pathname.field_2._M_allocated_capacity + 1);
    }
    bVar4 = is_valid_file(filepath);
    if (bVar4) {
      if (spdlog::details::registry::instance()::s_instance == '\0') {
        iVar5 = __cxa_guard_acquire(&spdlog::details::registry::instance()::s_instance);
        if (iVar5 != 0) {
          spdlog::details::registry::registry
                    ((registry *)spdlog::details::registry::instance()::s_instance);
          __cxa_atexit(spdlog::details::registry::~registry,
                       spdlog::details::registry::instance()::s_instance,&__dso_handle);
          __cxa_guard_release(&spdlog::details::registry::instance()::s_instance);
        }
      }
      uVar3 = spdlog::details::registry::instance()::s_instance._280_8_;
      pcVar2 = (filepath->_M_pathname)._M_dataplus._M_p;
      local_110._M_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,pcVar2,pcVar2 + (filepath->_M_pathname)._M_string_length);
      local_c8._0_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      local_c8._8_4_ = 0xb0;
      local_b8[0]._M_allocated_capacity = "get_image_paths";
      local_d8.data_ = "Adding file {}";
      local_d8.size_ = 0xe;
      loc_01._8_8_ = local_c8._8_8_;
      loc_01.filename =
           "/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/src/image.cpp"
      ;
      loc_01.funcname = "get_image_paths";
      spdlog::logger::log_<fmt::v7::basic_string_view<char>,std::__cxx11::string>
                ((logger *)uVar3,loc_01,debug,&local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_pathname._M_dataplus._M_p,
                        local_110._M_pathname.field_2._M_allocated_capacity + 1);
      }
      std::filesystem::absolute((path *)local_c8);
      std::filesystem::__cxx11::path::lexically_normal();
      std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
      emplace_back<std::filesystem::__cxx11::path>(__return_storage_ptr__,&local_110);
      CLI::std::filesystem::__cxx11::path::~path((path *)&local_110);
      CLI::std::filesystem::__cxx11::path::~path((path *)local_c8);
    }
    std::filesystem::__cxx11::recursive_directory_iterator::operator++(&local_98);
  }
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_88);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_98);
  std::filesystem::__cxx11::recursive_directory_iterator::~recursive_directory_iterator(&local_e8);
  CLI::std::filesystem::__cxx11::path::~path((path *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::filesystem::path>
get_image_paths(const std::filesystem::path& root)
{
    auto normalized = fs::absolute(root).lexically_normal();
    spdlog::info("Searching for images in {}", normalized.string());

    std::vector<fs::path> image_paths;
    for (auto&& dir_entry : fs::recursive_directory_iterator(normalized)) {
        SPDLOG_DEBUG("Found file {}", dir_entry.path().string());

        if (is_valid_file(dir_entry.path())) {
            SPDLOG_DEBUG("Adding file {}", dir_entry.path().string());

            image_paths.push_back(
              fs::absolute(dir_entry.path()).lexically_normal());
        }
    }

    return image_paths;
}